

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

void __thiscall LiteScript::State::GarbageCollector(State *this,offset_in_Memory_to_subr caller)

{
  pointer pvVar1;
  pointer pVVar2;
  pointer pNVar3;
  pointer pNVar4;
  pointer pNVar5;
  pointer pVVar6;
  pointer pNVar7;
  pointer pNVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  Variable local_50;
  ulong local_40;
  ulong local_38;
  
  Variable::Variable(&local_50,&this->nsp_global);
  Variable::GarbageCollector(&local_50,caller);
  Variable::~Variable(&local_50);
  local_40 = ((long)(this->args_tmp).
                    super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->args_tmp).
                   super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff;
  uVar9 = 0;
  while (uVar9 != local_40) {
    pvVar1 = (this->args_tmp).
             super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar2 = *(pointer *)
              ((long)&pvVar1[uVar9].
                      super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                      ._M_impl.super__Vector_impl_data + 8);
    lVar11 = *(long *)&pvVar1[uVar9].
                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                       ._M_impl.super__Vector_impl_data;
    local_38 = uVar9;
    for (uVar10 = 0; ((long)pVVar2 - lVar11 & 0xffffffff0U) != uVar10; uVar10 = uVar10 + 0x10) {
      Variable::Variable(&local_50,
                         (Variable *)
                         (*(long *)&(this->args_tmp).
                                    super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                    super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                    ._M_impl.super__Vector_impl_data + uVar10));
      Variable::GarbageCollector(&local_50,caller);
      Variable::~Variable(&local_50);
    }
    uVar9 = local_38 + 1;
  }
  local_40 = ((long)(this->args_def).
                    super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->args_def).
                   super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff;
  uVar9 = 0;
  while (uVar9 != local_40) {
    pvVar1 = (this->args_def).
             super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar2 = *(pointer *)
              ((long)&pvVar1[uVar9].
                      super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                      ._M_impl.super__Vector_impl_data + 8);
    lVar11 = *(long *)&pvVar1[uVar9].
                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                       ._M_impl.super__Vector_impl_data;
    local_38 = uVar9;
    for (uVar10 = 0; ((long)pVVar2 - lVar11 & 0xffffffff0U) != uVar10; uVar10 = uVar10 + 0x10) {
      Variable::Variable(&local_50,
                         (Variable *)
                         (*(long *)&(this->args_def).
                                    super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                    super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                    ._M_impl.super__Vector_impl_data + uVar10));
      Variable::GarbageCollector(&local_50,caller);
      Variable::~Variable(&local_50);
    }
    uVar9 = local_38 + 1;
  }
  pNVar3 = (this->ths).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar4 = (this->ths).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar9 = 0; ((long)pNVar3 - (long)pNVar4 & 0x1fffffffe0U) != uVar9; uVar9 = uVar9 + 0x20) {
    pNVar5 = (this->ths).
             super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (**(char **)(pNVar5->data + uVar9 + 0x18) == '\0') {
      Variable::Variable(&local_50,(Variable *)(pNVar5->data + uVar9));
      Variable::GarbageCollector(&local_50,caller);
      Variable::~Variable(&local_50);
    }
  }
  pNVar3 = (this->rets).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar4 = (this->rets).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar9 = 0; ((long)pNVar3 - (long)pNVar4 & 0x1fffffffe0U) != uVar9; uVar9 = uVar9 + 0x20) {
    pNVar5 = (this->rets).
             super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (**(char **)(pNVar5->data + uVar9 + 0x18) == '\0') {
      Variable::Variable(&local_50,(Variable *)(pNVar5->data + uVar9));
      Variable::GarbageCollector(&local_50,caller);
      Variable::~Variable(&local_50);
    }
  }
  pVVar2 = (this->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar6 = (this->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar9 = 0; ((long)pVVar2 - (long)pVVar6 & 0xffffffff0U) != uVar9; uVar9 = uVar9 + 0x10) {
    Variable::Variable(&local_50,
                       (Variable *)
                       ((long)&((this->op_lifo).
                                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                ._M_impl.super__Vector_impl_data._M_start)->obj + uVar9));
    Variable::GarbageCollector(&local_50,caller);
    Variable::~Variable(&local_50);
  }
  pNVar7 = (this->nsp_lifo).
           super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pNVar8 = (this->nsp_lifo).
           super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar11 = 0; (((long)pNVar7 - (long)pNVar8) / 0x48 & 0xffffffffU) * 0x48 - lVar11 != 0;
      lVar11 = lVar11 + 0x48) {
    Namer::GarbageCollector
              ((Namer *)((((this->nsp_lifo).
                           super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>
                           ._M_impl.super__Vector_impl_data._M_start)->current).data +
                        lVar11 + -0x10),caller);
  }
  return;
}

Assistant:

void LiteScript::State::GarbageCollector(bool (Memory::*caller)(unsigned int)) const {
    Variable(this->nsp_global).GarbageCollector(caller);
    for (unsigned int i = 0, sz_i = this->args_tmp.size(); i < sz_i; i++) {
        for (unsigned int j = 0, sz_j = this->args_tmp[i].size(); j < sz_j; j++)
            Variable(this->args_tmp[i][j]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz_i = this->args_def.size(); i < sz_i; i++) {
        for (unsigned int j = 0, sz_j = this->args_def[i].size(); j < sz_j; j++)
            Variable(this->args_def[i][j]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz_i = this->ths.size(); i < sz_i; i++) {
        if (!this->ths[i].isNull)
            Variable(*this->ths[i]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz_i = this->rets.size(); i < sz_i; i++) {
        if (!this->rets[i].isNull)
            Variable(*this->rets[i]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz = this->op_lifo.size(); i < sz; i++)
        Variable(this->op_lifo[i]).GarbageCollector(caller);
    for (unsigned int i = 0, sz = this->nsp_lifo.size(); i < sz; i++)
        this->nsp_lifo[i].GarbageCollector(caller);
}